

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::AnalyzeVariableScopeAccessHandler
          (AnalyzeVariableScopeAccessHandler *this,Compiler *compiler_,SPIRFunction *entry_)

{
  (this->super_OpcodeHandler)._vptr_OpcodeHandler =
       (_func_int **)&PTR__AnalyzeVariableScopeAccessHandler_003fa2c8;
  this->compiler = compiler_;
  this->entry = entry_;
  (this->accessed_variables_to_block)._M_h._M_buckets =
       &(this->accessed_variables_to_block)._M_h._M_single_bucket;
  (this->accessed_variables_to_block)._M_h._M_bucket_count = 1;
  (this->accessed_variables_to_block)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->accessed_variables_to_block)._M_h._M_element_count = 0;
  (this->accessed_variables_to_block)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->accessed_variables_to_block)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->accessed_variables_to_block)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->accessed_temporaries_to_block)._M_h._M_buckets =
       &(this->accessed_temporaries_to_block)._M_h._M_single_bucket;
  (this->accessed_temporaries_to_block)._M_h._M_bucket_count = 1;
  (this->accessed_temporaries_to_block)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->accessed_temporaries_to_block)._M_h._M_element_count = 0;
  (this->accessed_temporaries_to_block)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->accessed_temporaries_to_block)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->accessed_temporaries_to_block)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->result_id_to_type)._M_h._M_buckets = &(this->result_id_to_type)._M_h._M_single_bucket;
  (this->result_id_to_type)._M_h._M_bucket_count = 1;
  (this->result_id_to_type)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->result_id_to_type)._M_h._M_element_count = 0;
  (this->result_id_to_type)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->result_id_to_type)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->result_id_to_type)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->complete_write_variables_to_block)._M_h._M_buckets =
       &(this->complete_write_variables_to_block)._M_h._M_single_bucket;
  (this->complete_write_variables_to_block)._M_h._M_bucket_count = 1;
  (this->complete_write_variables_to_block)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->complete_write_variables_to_block)._M_h._M_element_count = 0;
  (this->complete_write_variables_to_block)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->complete_write_variables_to_block)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->complete_write_variables_to_block)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->partial_write_variables_to_block)._M_h._M_buckets =
       &(this->partial_write_variables_to_block)._M_h._M_single_bucket;
  (this->partial_write_variables_to_block)._M_h._M_bucket_count = 1;
  (this->partial_write_variables_to_block)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->partial_write_variables_to_block)._M_h._M_element_count = 0;
  (this->partial_write_variables_to_block)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->partial_write_variables_to_block)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->partial_write_variables_to_block)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->access_chain_expressions)._M_h._M_buckets =
       &(this->access_chain_expressions)._M_h._M_single_bucket;
  (this->access_chain_expressions)._M_h._M_bucket_count = 1;
  (this->access_chain_expressions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->access_chain_expressions)._M_h._M_element_count = 0;
  (this->access_chain_expressions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->access_chain_expressions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->access_chain_expressions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->rvalue_forward_children)._M_h._M_buckets =
       &(this->rvalue_forward_children)._M_h._M_single_bucket;
  (this->rvalue_forward_children)._M_h._M_bucket_count = 1;
  (this->rvalue_forward_children)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rvalue_forward_children)._M_h._M_element_count = 0;
  (this->rvalue_forward_children)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rvalue_forward_children)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rvalue_forward_children)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->current_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

Compiler::AnalyzeVariableScopeAccessHandler::AnalyzeVariableScopeAccessHandler(Compiler &compiler_,
                                                                               SPIRFunction &entry_)
    : compiler(compiler_)
    , entry(entry_)
{
}